

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode)

{
  bool bVar1;
  ulong uVar2;
  reference pPVar3;
  SectionNode *pSVar4;
  char *this_00;
  allocator local_281;
  string local_280;
  __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_260;
  const_iterator itEnd;
  const_iterator it;
  allocator local_229;
  string local_228 [32];
  undefined1 local_208 [8];
  string local_200;
  allocator local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  ScopedElement e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string name;
  SectionNode *sectionNode_local;
  string *rootName_local;
  string *className_local;
  JunitReporter *this_local;
  
  name.field_2._8_8_ = sectionNode;
  trim((string *)local_48,&(sectionNode->stats).sectionInfo.name);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+(&local_88,rootName,'/');
    std::operator+(&local_68,&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  bVar1 = std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::empty
                    ((vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *)
                     (name.field_2._8_8_ + 0xa8));
  if (((!bVar1) || (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) ||
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"testcase",&local_c1);
    XmlWriter::scopedElement((XmlWriter *)local_a0,(string *)&this->xml);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_138,"classname",&local_139);
      XmlWriter::writeAttribute(&this->xml,&local_138,className);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_160,"name",&local_161);
      XmlWriter::writeAttribute(&this->xml,&local_160,(string *)local_48);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,"classname",&local_e9);
      XmlWriter::writeAttribute(&this->xml,&local_e8,(string *)local_48);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_110,"name",&local_111);
      XmlWriter::writeAttribute<char[5]>(&this->xml,&local_110,(char (*) [5])"root");
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
    }
    std::allocator<char>::allocator();
    this_00 = "time";
    std::__cxx11::string::string((string *)&local_188,"time",&local_189);
    Catch::toString_abi_cxx11_
              ((string *)(local_1b8 + 8),(Catch *)this_00,*(double *)(name.field_2._8_8_ + 0x80));
    XmlWriter::writeAttribute(&this->xml,&local_188,(string *)(local_1b8 + 8));
    std::__cxx11::string::~string((string *)(local_1b8 + 8));
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    writeAssertions(this,(SectionNode *)name.field_2._8_8_);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"system-out",&local_1d9);
      XmlWriter::scopedElement((XmlWriter *)local_1b8,(string *)&this->xml);
      trim((string *)(local_208 + 8),(string *)(name.field_2._8_8_ + 0xc0));
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)local_1b8,(string *)(local_208 + 8),false);
      std::__cxx11::string::~string((string *)(local_208 + 8));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1b8);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,"system-err",&local_229);
      XmlWriter::scopedElement((XmlWriter *)local_208,(string *)&this->xml);
      trim((string *)&it,(string *)(name.field_2._8_8_ + 0xe0));
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_208,(string *)&it,false);
      std::__cxx11::string::~string((string *)&it);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_208);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a0);
  }
  itEnd = std::
          vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
          ::begin((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                   *)(name.field_2._8_8_ + 0x90));
  local_260._M_current =
       (Ptr<Catch::CumulativeReporterBase::SectionNode> *)
       std::
       vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
       ::end((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
              *)(name.field_2._8_8_ + 0x90));
  while (bVar1 = __gnu_cxx::operator!=(&itEnd,&local_260), bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pPVar3 = __gnu_cxx::
               __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
               ::operator*(&itEnd);
      pSVar4 = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(pPVar3);
      writeSection(this,className,(string *)local_48,pSVar4);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_280,"",&local_281);
      pPVar3 = __gnu_cxx::
               __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
               ::operator*(&itEnd);
      pSVar4 = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(pPVar3);
      writeSection(this,(string *)local_48,&local_280,pSVar4);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
    ::operator++(&itEnd);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void writeSection(  std::string const& className,
                            std::string const& rootName,
                            SectionNode const& sectionNode ) {
            std::string name = trim( sectionNode.stats.sectionInfo.name );
            if( !rootName.empty() )
                name = rootName + '/' + name;

            if( !sectionNode.assertions.empty() ||
                !sectionNode.stdOut.empty() ||
                !sectionNode.stdErr.empty() ) {
                XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
                if( className.empty() ) {
                    xml.writeAttribute( "classname", name );
                    xml.writeAttribute( "name", "root" );
                }
                else {
                    xml.writeAttribute( "classname", className );
                    xml.writeAttribute( "name", name );
                }
                xml.writeAttribute( "time", Catch::toString( sectionNode.stats.durationInSeconds ) );

                writeAssertions( sectionNode );

                if( !sectionNode.stdOut.empty() )
                    xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), false );
                if( !sectionNode.stdErr.empty() )
                    xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), false );
            }
            for( SectionNode::ChildSections::const_iterator
                    it = sectionNode.childSections.begin(),
                    itEnd = sectionNode.childSections.end();
                    it != itEnd;
                    ++it )
                if( className.empty() )
                    writeSection( name, "", **it );
                else
                    writeSection( className, name, **it );
        }